

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall helics::BrokerBase::setErrorState(BrokerBase *this,int eCode,string_view estring)

{
  string_view name;
  bool bVar1;
  BrokerState BVar2;
  GlobalBrokerId GVar3;
  int *piVar4;
  int in_ESI;
  long in_RDI;
  atomic<helics::GlobalBrokerId> *paVar5;
  string_view in_stack_00000030;
  ActionMessage echeck;
  ActionMessage halt;
  BrokerState cBrokerState;
  memory_order __b;
  ActionMessage *in_stack_fffffffffffffd88;
  BrokerBase *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  action_t in_stack_fffffffffffffda4;
  memory_order __m;
  ActionMessage *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  GlobalFederateId local_1e4;
  BaseType local_1e0;
  GlobalFederateId local_1dc;
  BaseType local_1d8;
  GlobalFederateId local_1d4;
  ActionMessage local_1d0;
  undefined8 in_stack_fffffffffffffee8;
  BrokerBase *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  GlobalBrokerId in_stack_ffffffffffffff00;
  GlobalFederateId in_stack_ffffffffffffff04;
  GlobalFederateId in_stack_ffffffffffffff0c;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  int local_18;
  memory_order local_14;
  int local_10;
  int local_c;
  int *local_8;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),in_stack_fffffffffffffd98
             ,(size_type)in_stack_fffffffffffffd90);
  piVar4 = (int *)(in_RDI + 0x228);
  local_10 = 5;
  local_c = in_ESI;
  local_8 = piVar4;
  local_14 = CLI::std::operator&(seq_cst,__memory_order_mask);
  local_18 = local_c;
  if (local_10 == 3) {
    *piVar4 = local_c;
  }
  else if (local_10 == 5) {
    LOCK();
    *piVar4 = local_c;
    UNLOCK();
  }
  else {
    *piVar4 = local_c;
  }
  BVar2 = CLI::std::atomic<helics::BrokerBase::BrokerState>::load
                    ((atomic<helics::BrokerBase::BrokerState> *)(in_RDI + 0x290),seq_cst);
  if ((BVar2 != ERRORED) && (BVar2 != CONNECTED_ERROR)) {
    if ((BVar2 < ~TERMINATING) || (CONNECTED_ERROR < BVar2)) {
      CLI::std::atomic<helics::BrokerBase::BrokerState>::store
                ((atomic<helics::BrokerBase::BrokerState> *)(in_RDI + 0x290),ERRORED,seq_cst);
    }
    else {
      CLI::std::atomic<helics::BrokerBase::BrokerState>::store
                ((atomic<helics::BrokerBase::BrokerState> *)(in_RDI + 0x290),CONNECTED_ERROR,seq_cst
                );
    }
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x50),
                       (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
    if (((bVar1) || (in_ESI == 0x8f)) || (in_ESI == 0x82)) {
      paVar5 = (atomic<helics::GlobalBrokerId> *)(in_RDI + 8);
      GVar3 = CLI::std::atomic<helics::GlobalBrokerId>::load(paVar5,seq_cst);
      GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffff0c,GVar3);
      in_stack_ffffffffffffff00 = CLI::std::atomic<helics::GlobalBrokerId>::load(paVar5,seq_cst);
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xffffffffffffff04,in_stack_ffffffffffffff00);
      ActionMessage::ActionMessage
                (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
                 (GlobalFederateId)(BaseType)((ulong)paVar5 >> 0x20),
                 (GlobalFederateId)(BaseType)paVar5);
      addActionMessage(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd90);
    }
    else {
      in_stack_fffffffffffffee8 = std::chrono::_V2::steady_clock::now();
      *(undefined8 *)(in_RDI + 0x218) = in_stack_fffffffffffffee8;
      paVar5 = (atomic<helics::GlobalBrokerId> *)(in_RDI + 8);
      __m = seq_cst;
      local_1d8 = (BaseType)CLI::std::atomic<helics::GlobalBrokerId>::load(paVar5,seq_cst);
      GlobalFederateId::GlobalFederateId(&local_1d4,(GlobalBrokerId)local_1d8);
      local_1e0 = (BaseType)CLI::std::atomic<helics::GlobalBrokerId>::load(paVar5,__m);
      GlobalFederateId::GlobalFederateId(&local_1dc,(GlobalBrokerId)local_1e0);
      ActionMessage::ActionMessage
                (&local_1d0,__m,
                 (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                 (GlobalFederateId)(BaseType)in_stack_fffffffffffffdb0);
      addActionMessage(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd90);
    }
  }
  GVar3 = CLI::std::atomic<helics::GlobalBrokerId>::load
                    ((atomic<helics::GlobalBrokerId> *)(in_RDI + 8),seq_cst);
  GlobalFederateId::GlobalFederateId(&local_1e4,GVar3);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd90);
  name._M_str._0_4_ = in_stack_ffffffffffffff00.gid;
  name._M_len = in_stack_fffffffffffffef8;
  name._M_str._4_4_ = in_stack_ffffffffffffff04.gid;
  sendToLogger(in_stack_fffffffffffffef0,in_stack_ffffffffffffff0c,
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),name,in_stack_00000030,
               SUB81((ulong)in_stack_fffffffffffffee8 >> 0x18,0));
  return;
}

Assistant:

void BrokerBase::setErrorState(int eCode, std::string_view estring)
{
    lastErrorString.assign(estring.data(), estring.size());
    lastErrorCode.store(eCode);
    auto cBrokerState = brokerState.load();
    if (cBrokerState != BrokerState::ERRORED && cBrokerState != BrokerState::CONNECTED_ERROR) {
        if (cBrokerState > BrokerState::CONFIGURED && cBrokerState < BrokerState::TERMINATING) {
            brokerState.store(BrokerState::CONNECTED_ERROR);
        } else {
            brokerState.store(BrokerState::ERRORED);
        }
        if (errorDelay <= timeZero || eCode == HELICS_ERROR_TERMINATED ||
            eCode == HELICS_ERROR_USER_ABORT) {
            const ActionMessage halt(CMD_USER_DISCONNECT, global_id.load(), global_id.load());
            addActionMessage(halt);
        } else {
            errorTimeStart = std::chrono::steady_clock::now();
            const ActionMessage echeck(CMD_ERROR_CHECK, global_id.load(), global_id.load());
            addActionMessage(echeck);
        }
    }

    sendToLogger(global_id.load(), HELICS_LOG_LEVEL_ERROR, identifier, estring);
}